

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> __thiscall
duckdb::LoadInfo::Deserialize(LoadInfo *this,Deserializer *deserializer)

{
  LoadInfo *this_00;
  pointer pLVar1;
  _Head_base<0UL,_duckdb::LoadInfo_*,_false> local_20;
  
  this_00 = (LoadInfo *)operator_new(0x80);
  LoadInfo(this_00);
  local_20._M_head_impl = this_00;
  pLVar1 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,200,"filename",&pLVar1->filename);
  pLVar1 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_20);
  Deserializer::ReadProperty<duckdb::LoadType>(deserializer,0xc9,"load_type",&pLVar1->load_type);
  pLVar1 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xca,"repository",&pLVar1->repository);
  pLVar1 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,0xcb,"version",&pLVar1->version);
  pLVar1 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      &local_20);
  Deserializer::ReadPropertyWithDefault<bool>
            (deserializer,0xcc,"repo_is_alias",&pLVar1->repo_is_alias);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)
         (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>_>)this;
}

Assistant:

unique_ptr<ParseInfo> LoadInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<LoadInfo>(new LoadInfo());
	deserializer.ReadPropertyWithDefault<string>(200, "filename", result->filename);
	deserializer.ReadProperty<LoadType>(201, "load_type", result->load_type);
	deserializer.ReadPropertyWithDefault<string>(202, "repository", result->repository);
	deserializer.ReadPropertyWithDefault<string>(203, "version", result->version);
	deserializer.ReadPropertyWithDefault<bool>(204, "repo_is_alias", result->repo_is_alias);
	return std::move(result);
}